

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O3

void amqp_messenger_do_work(AMQP_MESSENGER_HANDLE messenger_handle)

{
  MESSAGE_RECEIVER_STATE MVar1;
  char cVar2;
  int iVar3;
  AMQP_MESSENGER_STATE AVar4;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  AMQP_MESSENGER_CONFIG *pAVar5;
  LINK_HANDLE pLVar6;
  MESSAGE_SENDER_HANDLE message_sender;
  MESSAGE_RECEIVER_HANDLE message_receiver;
  AMQP_MESSENGER_STATE_CHANGED_CALLBACK p_Var7;
  AMQP_MESSENGER_STATE AVar8;
  AMQP_MESSENGER_STATE previous_state;
  void *pvVar9;
  char *pcVar10;
  _Bool is_timed_out;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 uVar12;
  undefined8 uVar11;
  _Bool local_a;
  _Bool local_9;
  
  uVar12 = (undefined4)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
               ,"amqp_messenger_do_work",0x566,1,"Invalid argument (messenger_handle is NULL)");
    return;
  }
  AVar4 = messenger_handle->state;
  if (AVar4 == AMQP_MESSENGER_STATE_STARTING) {
    switch(messenger_handle->message_sender_current_state) {
    case MESSAGE_SENDER_STATE_IDLE:
      goto switchD_0013c796_caseD_1;
    case MESSAGE_SENDER_STATE_OPENING:
      iVar3 = is_timeout_reached(messenger_handle->last_message_sender_state_change_time,300,
                                 &local_a);
      if (iVar3 == 0) {
        if (local_a != true) goto LAB_0013c9a0;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar10 = 
          "messenger failed to start (messagesender failed to start within expected timeout (%d secs))"
          ;
          iVar3 = 0x52c;
          goto LAB_0013c97a;
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar10 = "messenger failed to start (failed to verify messagesender start timeout)";
          iVar3 = 0x527;
LAB_0013c97a:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                     ,"process_state_changes",iVar3,1,pcVar10);
        }
      }
      goto LAB_0013c985;
    case MESSAGE_SENDER_STATE_OPEN:
      messenger_handle->state = AMQP_MESSENGER_STATE_STARTED;
      pAVar5 = messenger_handle->config;
      if (pAVar5 != (AMQP_MESSENGER_CONFIG *)0x0) {
        p_Var7 = pAVar5->on_state_changed_callback;
        if (p_Var7 == (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0) goto LAB_0013c9a0;
        pvVar9 = pAVar5->on_state_changed_context;
        AVar4 = AMQP_MESSENGER_STATE_STARTING;
        AVar8 = AMQP_MESSENGER_STATE_STARTED;
        goto LAB_0013c8ff;
      }
      goto LAB_0013ca4a;
    case MESSAGE_SENDER_STATE_CLOSING:
    case MESSAGE_SENDER_STATE_ERROR:
      goto switchD_0013c796_caseD_4;
    default:
      goto switchD_0013c796_default;
    }
  }
  if (AVar4 == AMQP_MESSENGER_STATE_STARTED) {
    if (messenger_handle->message_sender_current_state != MESSAGE_SENDER_STATE_OPEN) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        uVar11 = CONCAT44(uVar12,messenger_handle->message_sender_current_state);
        pcVar10 = "messagesender reported unexpected state %d while messenger was started";
        iVar3 = 0x4ff;
        goto LAB_0013c8bf;
      }
      goto LAB_0013c8ca;
    }
    if (messenger_handle->message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) goto LAB_0013c9a0;
    MVar1 = messenger_handle->message_receiver_current_state;
    if ((MVar1 == MESSAGE_RECEIVER_STATE_IDLE) || (MVar1 == MESSAGE_RECEIVER_STATE_ERROR)) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        uVar11 = CONCAT44(uVar12,messenger_handle->message_receiver_current_state);
        pcVar10 = "messagereceiver reported unexpected state %d while messenger is starting";
        iVar3 = 0x515;
        goto LAB_0013c8bf;
      }
      goto LAB_0013c8ca;
    }
    if (MVar1 == MESSAGE_RECEIVER_STATE_OPENING) {
      iVar3 = is_timeout_reached(messenger_handle->last_message_receiver_state_change_time,300,
                                 &local_9);
      if (iVar3 == 0) {
        if (local_9 != true) goto LAB_0013c9a0;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar10 = 
          "messenger got an error (messagereceiver failed to start within expected timeout (%d secs))"
          ;
          iVar3 = 0x50e;
          goto LAB_0013c97a;
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar10 = "messenger got an error (failed to verify messagereceiver start timeout)";
          iVar3 = 0x509;
          goto LAB_0013c97a;
        }
      }
LAB_0013c985:
      AVar4 = messenger_handle->state;
      if (AVar4 == AMQP_MESSENGER_STATE_ERROR) goto LAB_0013c9a0;
      messenger_handle->state = AMQP_MESSENGER_STATE_ERROR;
      pAVar5 = messenger_handle->config;
      if (pAVar5 == (AMQP_MESSENGER_CONFIG *)0x0) goto LAB_0013c9a0;
      goto LAB_0013c8e9;
    }
    goto LAB_0013c9a0;
  }
  goto LAB_0013c9a3;
switchD_0013c796_caseD_1:
  if (messenger_handle->message_sender == (MESSAGE_SENDER_HANDLE)0x0) goto LAB_0013c9a0;
switchD_0013c796_caseD_4:
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    uVar11 = CONCAT44(uVar12,messenger_handle->message_sender_current_state);
    pcVar10 = "messagesender reported unexpected state %d while messenger is starting";
    iVar3 = 0x536;
LAB_0013c8bf:
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
               ,"process_state_changes",iVar3,1,pcVar10,uVar11);
  }
LAB_0013c8ca:
  AVar4 = messenger_handle->state;
  if (AVar4 == AMQP_MESSENGER_STATE_ERROR) goto LAB_0013cc7d;
  messenger_handle->state = AMQP_MESSENGER_STATE_ERROR;
  pAVar5 = messenger_handle->config;
  if (pAVar5 == (AMQP_MESSENGER_CONFIG *)0x0) goto LAB_0013cc7d;
LAB_0013c8e9:
  p_Var7 = pAVar5->on_state_changed_callback;
  if (p_Var7 != (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0) {
    pvVar9 = pAVar5->on_state_changed_context;
    AVar8 = AMQP_MESSENGER_STATE_ERROR;
LAB_0013c8ff:
    (*p_Var7)(pvVar9,AVar4,AVar8);
  }
LAB_0013c9a0:
  AVar4 = messenger_handle->state;
LAB_0013c9a3:
  if (AVar4 == AMQP_MESSENGER_STATE_STARTED) {
LAB_0013ca4a:
    cVar2 = messenger_handle->receive_messages;
    if (((_Bool)cVar2 == true) &&
       (messenger_handle->message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0)) {
      pAVar5 = messenger_handle->config;
      pLVar6 = create_link(true,messenger_handle->session_handle,&pAVar5->receive_link,
                           pAVar5->iothub_host_fqdn,pAVar5->device_id,pAVar5->module_id);
      messenger_handle->receiver_link = pLVar6;
      if (pLVar6 == (LINK_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                     ,"create_message_receiver",0x341,1,"Failed creating the message receiver link")
          ;
        }
      }
      else {
        message_receiver =
             messagereceiver_create
                       (pLVar6,on_message_receiver_state_changed_callback,messenger_handle);
        messenger_handle->message_receiver = message_receiver;
        if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed creating the message receiver (messagereceiver_create failed)";
            iVar3 = 0x346;
LAB_0013cc1d:
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                       ,"create_message_receiver",iVar3,1,pcVar10);
          }
        }
        else {
          iVar3 = messagereceiver_open
                            (message_receiver,on_message_received_internal_callback,messenger_handle
                            );
          if (iVar3 == 0) {
            cVar2 = messenger_handle->receive_messages;
            goto LAB_0013ca58;
          }
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed opening the AMQP message receiver.";
            iVar3 = 0x34c;
            goto LAB_0013cc1d;
          }
        }
        destroy_message_receiver(messenger_handle);
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                   ,"manage_amqp_messengers",0x550,1,
                   "amqp_messenger_do_work warning (failed creating the message receiver [%s])",
                   messenger_handle->config->device_id);
      }
    }
    else {
LAB_0013ca58:
      if ((cVar2 == '\0') && (messenger_handle->message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0)) {
        destroy_message_receiver(messenger_handle);
      }
    }
  }
  else if (AVar4 == AMQP_MESSENGER_STATE_STARTING) {
switchD_0013c796_default:
    if (messenger_handle->message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
      pAVar5 = messenger_handle->config;
      pLVar6 = create_link(false,messenger_handle->session_handle,&pAVar5->send_link,
                           pAVar5->iothub_host_fqdn,pAVar5->device_id,pAVar5->module_id);
      messenger_handle->sender_link = pLVar6;
      if (pLVar6 == (LINK_HANDLE)0x0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                     ,"create_message_sender",0x285,1,"Failed creating the message sender link");
        }
      }
      else {
        message_sender =
             messagesender_create(pLVar6,on_message_sender_state_changed_callback,messenger_handle);
        messenger_handle->message_sender = message_sender;
        if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed creating the message sender (messagesender_create failed)";
            iVar3 = 0x28a;
LAB_0013cb6f:
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                       ,"create_message_sender",iVar3,1,pcVar10);
          }
        }
        else {
          iVar3 = messagesender_open(message_sender);
          if (iVar3 == 0) goto LAB_0013cc6e;
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed opening the AMQP message sender.";
            iVar3 = 0x292;
            goto LAB_0013cb6f;
          }
        }
        destroy_message_sender(messenger_handle);
      }
      AVar4 = messenger_handle->state;
      if (AVar4 == AMQP_MESSENGER_STATE_ERROR) goto LAB_0013cc7d;
      messenger_handle->state = AMQP_MESSENGER_STATE_ERROR;
      pAVar5 = messenger_handle->config;
      if (pAVar5 == (AMQP_MESSENGER_CONFIG *)0x0) goto LAB_0013cc7d;
      if (pAVar5->on_state_changed_callback != (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0) {
        (*pAVar5->on_state_changed_callback)
                  (pAVar5->on_state_changed_context,AVar4,AMQP_MESSENGER_STATE_ERROR);
      }
    }
  }
LAB_0013cc6e:
  if (messenger_handle->state == AMQP_MESSENGER_STATE_STARTED) {
    message_queue_do_work(messenger_handle->send_queue);
  }
LAB_0013cc7d:
  if (messenger_handle->max_send_error_count <= messenger_handle->send_error_count) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                 ,"handle_errors_and_timeouts",0x55d,1,
                 "Reached max number of consecutive send failures (%s, %lu)",
                 messenger_handle->config->device_id,messenger_handle->max_send_error_count);
    }
    AVar4 = messenger_handle->state;
    if (AVar4 != AMQP_MESSENGER_STATE_ERROR) {
      messenger_handle->state = AMQP_MESSENGER_STATE_ERROR;
      pAVar5 = messenger_handle->config;
      if ((pAVar5 != (AMQP_MESSENGER_CONFIG *)0x0) &&
         (pAVar5->on_state_changed_callback != (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0)) {
        (*pAVar5->on_state_changed_callback)
                  (pAVar5->on_state_changed_context,AVar4,AMQP_MESSENGER_STATE_ERROR);
      }
    }
  }
  return;
}

Assistant:

void amqp_messenger_do_work(AMQP_MESSENGER_HANDLE messenger_handle)
{
    if (messenger_handle == NULL)
    {
        LogError("Invalid argument (messenger_handle is NULL)");
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* msgr = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        process_state_changes(msgr);

        manage_amqp_messengers(msgr);

        if (msgr->state == AMQP_MESSENGER_STATE_STARTED)
        {
            message_queue_do_work(msgr->send_queue);
        }

        handle_errors_and_timeouts(msgr);
    }
}